

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

void __thiscall
Js::ConcatStringBase::CopyImpl
          (ConcatStringBase *this,char16 *buffer,int itemCount,JavascriptString **items,
          StringCopyInfoStack *nestedStringTreeCopyInfos,byte recursionDepth)

{
  char16 *dst;
  JavascriptString *this_00;
  code *pcVar1;
  StringCopyInfo copyInfo;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  int iVar5;
  charcount_t cVar6;
  undefined4 *puVar7;
  char16 *str;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  undefined7 in_register_00000089;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  StringCopyInfo local_98;
  JavascriptString **local_80;
  JavascriptString **newItems;
  StringCopyInfoStack *local_70;
  uint local_64;
  undefined8 local_60;
  JavascriptString **local_58;
  JavascriptString *local_50;
  char16 *local_48;
  undefined4 *local_40;
  charcount_t local_34;
  
  local_60 = CONCAT44(in_register_00000014,itemCount);
  newItems = (JavascriptString **)CONCAT71(in_register_00000089,recursionDepth);
  local_70 = nestedStringTreeCopyInfos;
  local_50 = (JavascriptString *)this;
  local_48 = buffer;
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xe7,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00a0bcb4;
    *puVar7 = 0;
  }
  if (local_48 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xe8,"(buffer)","buffer");
    if (!bVar2) goto LAB_00a0bcb4;
    *puVar7 = 0;
    local_40 = puVar7;
  }
  else {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  local_64 = (int)newItems + 1U & 0xff;
  uVar10 = 0;
  for (iVar8 = 0; cVar4 = (charcount_t)uVar10, iVar8 < (int)local_60; iVar8 = iVar8 + 1) {
    this_00 = items[iVar8];
    if (this_00 != (JavascriptString *)0x0) {
      bVar2 = JavascriptString::IsFinalized(this_00);
      if (bVar2) {
        local_58 = items;
        cVar3 = JavascriptString::GetLength(this_00);
        uVar9 = cVar4 + cVar3;
        cVar4 = JavascriptString::GetLength(local_50);
        if (cVar4 < uVar9) {
          AssertCount = AssertCount + 1;
          local_34 = cVar3;
          Throw::LogAssert();
          puVar7 = local_40;
          *local_40 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,0xf7,
                                      "(copiedCharLength + copyCharLength <= this->GetLength())",
                                      "copiedCharLength + copyCharLength <= this->GetLength()");
          if (!bVar2) goto LAB_00a0bcb4;
          *puVar7 = 0;
          cVar3 = local_34;
        }
        dst = local_48 + uVar10;
        str = JavascriptString::GetString(this_00);
        JavascriptString::CopyHelper(dst,str,cVar3);
      }
      else {
        if (iVar8 == (int)local_60 + -1) {
          iVar5 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x69])
                            (this_00,&local_80);
          if (iVar5 != -1) {
            iVar8 = -1;
            items = local_80;
            local_60 = CONCAT44(extraout_var,iVar5);
            goto LAB_00a0bc4e;
          }
        }
        local_58 = items;
        cVar3 = JavascriptString::GetLength(this_00);
        cVar6 = JavascriptString::GetLength(local_50);
        if (cVar6 - cVar4 < cVar3) {
          AssertCount = AssertCount + 1;
          local_34 = cVar3;
          Throw::LogAssert();
          puVar7 = local_40;
          *local_40 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,0x10d,"(copyCharLength <= GetLength() - copiedCharLength)",
                                      "copyCharLength <= GetLength() - copiedCharLength");
          if (!bVar2) goto LAB_00a0bcb4;
          *puVar7 = 0;
          cVar3 = local_34;
        }
        if ((byte)newItems == 3) {
          iVar5 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(this_00);
          if ((char)iVar5 == '\0') goto LAB_00a0bc30;
          StringCopyInfo::StringCopyInfo(&local_98,this_00,local_48 + uVar10);
          copyInfo.destinationBuffer = local_98.destinationBuffer;
          copyInfo.sourceString = local_98.sourceString;
          copyInfo.isInitialized = local_98.isInitialized;
          copyInfo._17_7_ = local_98._17_7_;
          StringCopyInfoStack::Push(local_70,copyInfo);
        }
        else {
          if (3 < (byte)newItems) {
            AssertCount = AssertCount + 1;
            local_34 = cVar3;
            Throw::LogAssert();
            puVar7 = local_40;
            *local_40 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,0x118,"(recursionDepth <= MaxCopyRecursionDepth)",
                                        "recursionDepth <= MaxCopyRecursionDepth");
            if (!bVar2) goto LAB_00a0bcb4;
            *puVar7 = 0;
            cVar3 = local_34;
          }
LAB_00a0bc30:
          JavascriptString::Copy(this_00,local_48 + uVar10,local_70,(byte)local_64);
        }
        uVar9 = cVar4 + cVar3;
      }
      uVar10 = (ulong)uVar9;
      items = local_58;
    }
LAB_00a0bc4e:
  }
  cVar3 = JavascriptString::GetLength(local_50);
  if (cVar4 != cVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = local_40;
    *local_40 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x11e,"(copiedCharLength == GetLength())",
                                "copiedCharLength == GetLength()");
    if (!bVar2) {
LAB_00a0bcb4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void ConcatStringBase::CopyImpl(_Out_writes_(m_charLength) char16 *const buffer,
            int itemCount, _In_reads_(itemCount) JavascriptString * const * items,
            StringCopyInfoStack &nestedStringTreeCopyInfos, const byte recursionDepth)
    {

        Assert(!IsFinalized());
        Assert(buffer);

        CharCount copiedCharLength = 0;
        for(int i = 0; i < itemCount; ++i)
        {
            JavascriptString *const s = items[i];
            if(!s)
            {
                continue;
            }

            if (s->IsFinalized())
            {
                // If we have the buffer already, just copy it
                const CharCount copyCharLength = s->GetLength();
                AnalysisAssert(copiedCharLength + copyCharLength <= this->GetLength());
                CopyHelper(&buffer[copiedCharLength], s->GetString(), copyCharLength);
                copiedCharLength += copyCharLength;
                continue;
            }

            if(i == itemCount - 1)
            {
                JavascriptString * const * newItems;
                int newItemCount = s->GetRandomAccessItemsFromConcatString(newItems);
                if (newItemCount != -1)
                {
                    // Optimize for right-weighted ConcatString tree (the append case). Even though appending to a ConcatString will
                    // transition into a CompoundString fairly quickly, strings created by doing just a few appends are very common.
                    items = newItems;
                    itemCount = newItemCount;
                    i = -1;
                    continue;
                }
            }

            const CharCount copyCharLength = s->GetLength();
            AnalysisAssert(copyCharLength <= GetLength() - copiedCharLength);

            if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
            {
                // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                // the caller can deal with those after returning.
                nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[copiedCharLength]));
            }
            else
            {
                Assert(recursionDepth <= MaxCopyRecursionDepth);
                s->Copy(&buffer[copiedCharLength], nestedStringTreeCopyInfos, recursionDepth + 1);
            }
            copiedCharLength += copyCharLength;
        }

        Assert(copiedCharLength == GetLength());
    }